

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::
       parse_width<char,fmt::v5::formatter<std::chrono::duration<long,std::ratio<60l,1l>>,char,void>::spec_handler&>
                 (char *begin,char *end,spec_handler *handler)

{
  uint width;
  spec_handler *in_RDX;
  spec_handler *in_RSI;
  spec_handler *in_RDI;
  spec_handler *in_stack_ffffffffffffffc8;
  spec_handler *in_stack_ffffffffffffffd0;
  width_adapter<fmt::v5::formatter<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_char,_void>::spec_handler_&,_char>
  in_stack_ffffffffffffffd8;
  spec_handler *handler_00;
  char *in_stack_fffffffffffffff8;
  
  if ((*(char *)&in_RDI->f < '0') || ('9' < *(char *)&in_RDI->f)) {
    if (*(char *)&in_RDI->f == '{') {
      in_RDI = (spec_handler *)((long)&in_RDI->f + 1);
      handler_00 = in_RSI;
      if (in_RDI != in_RSI) {
        width_adapter<fmt::v5::formatter<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_char,_void>::spec_handler_&,_char>
        ::width_adapter((width_adapter<fmt::v5::formatter<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_char,_void>::spec_handler_&,_char>
                         *)&stack0xffffffffffffffd8,in_RDX);
        in_RDI = (spec_handler *)
                 parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::formatter<std::chrono::duration<long,std::ratio<60l,1l>>,char,void>::spec_handler&,char>>
                           (in_stack_fffffffffffffff8,(char *)in_RDI,
                            (width_adapter<fmt::v5::formatter<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_char,_void>::spec_handler_&,_char>
                             *)handler_00);
        in_stack_ffffffffffffffc8 = in_RSI;
      }
      if ((in_RDI == handler_00) || (*(char *)&in_RDI->f != '}')) {
        formatter<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_char,_void>::spec_handler::
        on_error(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
      }
      else {
        in_RDI = (spec_handler *)((long)&in_RDI->f + 1);
      }
    }
  }
  else {
    width = parse_nonnegative_int<char,fmt::v5::formatter<std::chrono::duration<long,std::ratio<60l,1l>>,char,void>::spec_handler&>
                      ((char **)in_stack_ffffffffffffffd8.handler,(char *)in_RDX,
                       in_stack_ffffffffffffffc8);
    formatter<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_char,_void>::spec_handler::on_width
              (in_RDX,width);
  }
  return (char *)in_RDI;
}

Assistant:

FMT_CONSTEXPR const Char *parse_width(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}